

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

bool CLI::detail::split_long(string *current,string *name,string *value)

{
  pointer __s;
  int iVar1;
  void *pvVar2;
  long lVar3;
  char *__data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (current->_M_string_length < 3) {
    return false;
  }
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (current,0,2,"--");
  if (iVar1 == 0) {
    __s = (current->_M_dataplus)._M_p;
    if ((byte)__s[2] < 0x22 || __s[2] == 0x2d) {
      return false;
    }
    if (current->_M_string_length != 0) {
      pvVar2 = memchr(__s,0x3d,current->_M_string_length);
      lVar3 = (long)pvVar2 - (long)__s;
      if (lVar3 != -1 && pvVar2 != (void *)0x0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_48,current,2,lVar3 - 2);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (name,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_48,current,lVar3 + 1,0xffffffffffffffff);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (value,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p == &local_48.field_2) {
          return true;
        }
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        return true;
      }
    }
    split_long();
    return true;
  }
  return false;
}

Assistant:

CLI11_INLINE bool split_long(const std::string &current, std::string &name, std::string &value) {
    if(current.size() > 2 && current.compare(0, 2, "--") == 0 && valid_first_char(current[2])) {
        auto loc = current.find_first_of('=');
        if(loc != std::string::npos) {
            name = current.substr(2, loc - 2);
            value = current.substr(loc + 1);
        } else {
            name = current.substr(2);
            value = "";
        }
        return true;
    }
    return false;
}